

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib504.c
# Opt level: O2

int test(char *URL)

{
  uint __i;
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int *piVar6;
  char *pcVar7;
  undefined8 uVar8;
  timeval tVar9;
  undefined8 uStack_1e0;
  int maxfd;
  int running;
  int numleft;
  timeval interval;
  fd_set wr;
  fd_set rd;
  fd_set exc;
  
  tv_test_start = tutil_tvnow();
  iVar1 = curl_global_init(3);
  uVar8 = _stderr;
  if (iVar1 != 0) {
    uVar2 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar8,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib504.c"
                  ,0x2f,iVar1,uVar2);
    goto LAB_0010142a;
  }
  lVar3 = curl_easy_init();
  if (lVar3 == 0) {
    lVar4 = 0;
    curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib504.c"
                  ,0x31);
    iVar1 = 0x7c;
    goto LAB_0010140a;
  }
  if (libtest_arg2 == (char *)0x0) {
LAB_00101357:
    iVar1 = curl_easy_setopt(lVar3,0x2712,URL);
    uVar8 = _stderr;
    if (iVar1 != 0) {
      uVar2 = curl_easy_strerror(iVar1);
      pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      lVar4 = 0;
      uStack_1e0 = 0x37;
      goto LAB_001013f9;
    }
    iVar1 = curl_easy_setopt(lVar3,0x29,1);
    uVar8 = _stderr;
    if (iVar1 != 0) {
      uVar2 = curl_easy_strerror(iVar1);
      pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      lVar4 = 0;
      uStack_1e0 = 0x38;
      goto LAB_001013f9;
    }
    lVar4 = curl_multi_init();
    if (lVar4 == 0) {
      lVar4 = 0;
      curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib504.c"
                    ,0x3a);
      iVar1 = 0x7b;
    }
    else {
      iVar1 = curl_multi_add_handle(lVar4,lVar3);
      uVar8 = _stderr;
      if (iVar1 != 0) {
        uVar2 = curl_multi_strerror(iVar1);
        pcVar7 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
        uStack_1e0 = 0x3c;
        goto LAB_001013f9;
      }
      do {
        maxfd = -99;
        interval.tv_sec = 1;
        interval.tv_usec = 0;
        curl_mfprintf(_stderr,"curl_multi_perform()\n");
        iVar1 = curl_multi_perform(lVar4,&running);
        uVar8 = _stderr;
        if (iVar1 != 0) {
          uVar2 = curl_multi_strerror(iVar1);
          pcVar7 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
          uStack_1e0 = 0x47;
          goto LAB_001013f9;
        }
        if (running < 0) {
          pcVar7 = 
          "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n";
          uStack_1e0 = 0x47;
LAB_00101705:
          curl_mfprintf(_stderr,pcVar7,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib504.c"
                        ,uStack_1e0);
          iVar1 = 0x7a;
          goto LAB_0010140a;
        }
        tVar9 = tutil_tvnow();
        lVar5 = tutil_tvdiff(tVar9,tv_test_start);
        if (60000 < lVar5) {
          uStack_1e0 = 0x49;
          goto LAB_00101681;
        }
        if (running == 0) {
          lVar5 = curl_multi_info_read(lVar4,&numleft);
          curl_mfprintf(_stderr,"Expected: not running\n");
          iVar1 = 0x78 - (uint)(numleft != 0 || lVar5 == 0);
          goto LAB_0010140a;
        }
        curl_mfprintf(_stderr,"running == %d\n");
        for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
          rd.__fds_bits[lVar5] = 0;
        }
        for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
          wr.__fds_bits[lVar5] = 0;
        }
        for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
          exc.__fds_bits[lVar5] = 0;
        }
        curl_mfprintf(_stderr,"curl_multi_fdset()\n");
        iVar1 = curl_multi_fdset(lVar4,&rd,&wr,&exc,&maxfd);
        uVar8 = _stderr;
        if (iVar1 != 0) {
          uVar2 = curl_multi_strerror(iVar1);
          pcVar7 = "%s:%d curl_multi_fdset() failed, with code %d (%s)\n";
          uStack_1e0 = 0x5e;
          goto LAB_001013f9;
        }
        if (maxfd < -1) {
          pcVar7 = "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n";
          uStack_1e0 = 0x5e;
          goto LAB_00101705;
        }
        iVar1 = select_wrapper(maxfd + 1,&rd,&wr,&exc,&interval);
        if (iVar1 == -1) {
          piVar6 = __errno_location();
          uVar8 = _stderr;
          iVar1 = *piVar6;
          pcVar7 = strerror(iVar1);
          curl_mfprintf(uVar8,"%s:%d select() failed, with errno %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib504.c"
                        ,0x62,iVar1,pcVar7);
          iVar1 = 0x79;
          goto LAB_0010140a;
        }
        tVar9 = tutil_tvnow();
        lVar5 = tutil_tvdiff(tVar9,tv_test_start);
      } while (lVar5 < 0xea61);
      uStack_1e0 = 100;
LAB_00101681:
      curl_mfprintf(_stderr,"%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib504.c"
                    ,uStack_1e0);
      iVar1 = 0x7d;
    }
  }
  else {
    iVar1 = curl_easy_setopt(lVar3,0x2714);
    uVar8 = _stderr;
    if (iVar1 == 0) goto LAB_00101357;
    uVar2 = curl_easy_strerror(iVar1);
    pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
    lVar4 = 0;
    uStack_1e0 = 0x36;
LAB_001013f9:
    curl_mfprintf(uVar8,pcVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib504.c"
                  ,uStack_1e0,iVar1,uVar2);
  }
LAB_0010140a:
  curl_multi_remove_handle(lVar4,lVar3);
  curl_multi_cleanup(lVar4);
  curl_easy_cleanup(lVar3);
  curl_global_cleanup();
LAB_0010142a:
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURL *c = NULL;
  int res = 0;
  CURLM *m = NULL;
  fd_set rd, wr, exc;
  int running;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  easy_init(c);

  /* The point here is that there must not be anything running on the given
     proxy port */
  if(libtest_arg2)
    easy_setopt(c, CURLOPT_PROXY, libtest_arg2);
  easy_setopt(c, CURLOPT_URL, URL);
  easy_setopt(c, CURLOPT_VERBOSE, 1L);

  multi_init(m);

  multi_add_handle(m, c);

  for(;;) {
    struct timeval interval;
    int maxfd = -99;

    interval.tv_sec = 1;
    interval.tv_usec = 0;

    fprintf(stderr, "curl_multi_perform()\n");

    multi_perform(m, &running);

    abort_on_test_timeout();

    if(!running) {
      /* This is where this code is expected to reach */
      int numleft;
      CURLMsg *msg = curl_multi_info_read(m, &numleft);
      fprintf(stderr, "Expected: not running\n");
      if(msg && !numleft)
        res = TEST_ERR_SUCCESS; /* this is where we should be */
      else
        res = TEST_ERR_FAILURE; /* not correct */
      break; /* done */
    }
    fprintf(stderr, "running == %d\n", running);

    FD_ZERO(&rd);
    FD_ZERO(&wr);
    FD_ZERO(&exc);

    fprintf(stderr, "curl_multi_fdset()\n");

    multi_fdset(m, &rd, &wr, &exc, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd + 1, &rd, &wr, &exc, &interval);

    abort_on_test_timeout();
  }

test_cleanup:

  /* proper cleanup sequence - type PA */

  curl_multi_remove_handle(m, c);
  curl_multi_cleanup(m);
  curl_easy_cleanup(c);
  curl_global_cleanup();

  return res;
}